

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Segment.cpp
# Opt level: O1

double __thiscall pobr::imgProcessing::structs::Segment::getHuMomentInvariantNo3(Segment *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double m10;
  double m01;
  double m00;
  double local_90;
  double local_88;
  double local_80;
  uint64_t local_78;
  double local_70;
  uint64_t local_68 [7];
  
  local_70 = 0.0;
  local_88 = 0.0;
  local_80 = getNormalMoment(this,(uint64_t *)&local_70,(uint64_t *)&local_88);
  local_88 = 0.0;
  local_90 = 4.94065645841247e-324;
  local_70 = local_80;
  local_88 = getNormalMoment(this,(uint64_t *)&local_88,(uint64_t *)&local_90);
  local_90 = 4.94065645841247e-324;
  local_78 = 0;
  local_90 = getNormalMoment(this,(uint64_t *)&local_90,&local_78);
  local_78 = 3;
  local_68[6] = 0;
  dVar1 = getCentralMoment(this,&local_78,local_68 + 6,&local_70,&local_90,&local_88);
  local_68[5] = 1;
  local_68[4] = 2;
  dVar2 = getCentralMoment(this,local_68 + 5,local_68 + 4,&local_70,&local_90,&local_88);
  dVar1 = dVar1 - dVar2 * 3.0;
  local_68[3] = 2;
  local_68[2] = 1;
  dVar2 = getCentralMoment(this,local_68 + 3,local_68 + 2,&local_70,&local_90,&local_88);
  local_68[1] = 0;
  local_68[0] = 3;
  dVar3 = getCentralMoment(this,local_68 + 1,local_68,&local_70,&local_90,&local_88);
  dVar3 = dVar2 * 3.0 - dVar3;
  dVar2 = pow(local_80,5.0);
  return (dVar3 * dVar3 + dVar1 * dVar1) / dVar2;
}

Assistant:

const double
Segment::getHuMomentInvariantNo3()
const
{
    const auto m00 = this->getNormalMoment(0, 0);
    const auto m01 = this->getNormalMoment(0, 1);
    const auto m10 = this->getNormalMoment(1, 0);

    return (
        (
            std::pow(
                (
                    (1 * this->getCentralMoment(3, 0, m00, m10, m01)) -
                    (3 * this->getCentralMoment(1, 2, m00, m10, m01))
                ),
                2
            )
            +
            std::pow(
                (
                    (3 * this->getCentralMoment(2, 1, m00, m10, m01)) -
                    (1 * this->getCentralMoment(0, 3, m00, m10, m01))
                ),
                2
            )
        )
        /
        std::pow(m00, 5)
    );
}